

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int BrotliEncoderCompressStream
              (BrotliEncoderState *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  MemoryManager *pMVar1;
  anon_union_16_2_c961180f_for_tiny_buf_ *__dest;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  BrotliEncoderStreamState BVar6;
  uint32_t *puVar7;
  ulong uVar8;
  uint8_t *puVar9;
  long lVar10;
  uint8_t *puVar11;
  int *table;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint8_t *puVar17;
  size_t sVar18;
  uint uVar19;
  bool bVar21;
  uint32_t *local_b0;
  uint32_t *local_98;
  uint8_t *local_90;
  uint8_t *local_88;
  size_t storage_ix;
  uint local_60;
  BrotliEncoderStreamState local_5c;
  uint8_t *local_58;
  size_t *local_50;
  uint16_t *local_48;
  uint8_t *local_40;
  size_t local_38;
  uint32_t uVar20;
  
  EnsureInitialized(s);
  if ((ulong)s->remaining_metadata_bytes_ != 0xffffffff) {
    if (op != BROTLI_OPERATION_EMIT_METADATA) {
      return 0;
    }
    if (*available_in != (ulong)s->remaining_metadata_bytes_) {
      return 0;
    }
LAB_001231bd:
    UpdateSizeHint(s,0);
    if (*available_in < 0x1000001) {
      if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
        s->remaining_metadata_bytes_ = (uint32_t)*available_in;
        s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
      }
      else if (1 < s->stream_state_ - BROTLI_STREAM_METADATA_HEAD) {
        return 0;
      }
      __dest = &s->tiny_buf_;
      do {
        while( true ) {
          do {
            iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
          } while (iVar4 != 0);
          if (s->available_out_ != 0) {
            return 1;
          }
          if (s->input_pos_ != s->last_flush_pos_) break;
          if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) {
            s->next_out_ = (uint8_t *)__dest;
            uVar5 = s->remaining_metadata_bytes_;
            bVar2 = s->last_bytes_bits_;
            uVar15 = (ulong)bVar2;
            *(uint16_t *)&s->tiny_buf_ = s->last_bytes_;
            s->last_bytes_ = 0;
            s->last_bytes_bits_ = '\0';
            *(ulong *)((long)&s->tiny_buf_ + (ulong)(bVar2 >> 3)) =
                 (ulong)(s->tiny_buf_).u8[bVar2 >> 3];
            uVar12 = uVar15 + 1 >> 3;
            uVar16 = (ulong)(bVar2 + 3 >> 3);
            uVar8 = uVar15 + 4;
            *(ulong *)((long)&s->tiny_buf_ + uVar12) =
                 3L << ((byte)(uVar15 + 1) & 7) | (ulong)(s->tiny_buf_).u8[uVar12];
            *(ulong *)((long)&s->tiny_buf_ + uVar16) = (ulong)(s->tiny_buf_).u8[uVar16];
            if ((ulong)uVar5 == 1) {
              uVar14 = 0;
LAB_001234ee:
              uVar12 = uVar15 + (ulong)uVar14 * 8;
              *(ulong *)((long)__dest + (uVar8 >> 3)) =
                   (ulong)uVar14 << ((byte)uVar8 & 7) | (ulong)__dest->u8[uVar8 >> 3];
              uVar8 = uVar15 + 6 >> 3;
              *(ulong *)((long)__dest + uVar8) =
                   (ulong)uVar5 - 1 << ((byte)(uVar15 + 6) & 7) | (ulong)__dest->u8[uVar8];
            }
            else {
              if (uVar5 != 0) {
                uVar14 = 0x1f;
                if (uVar5 - 1 != 0) {
                  for (; uVar5 - 1 >> uVar14 == 0; uVar14 = uVar14 - 1) {
                  }
                }
                uVar14 = (uVar14 ^ 0xffffffe0) + 0x28 >> 3;
                goto LAB_001234ee;
              }
              *(ulong *)((long)__dest + (uVar8 >> 3)) = (ulong)__dest->u8[uVar8 >> 3];
              uVar12 = uVar15;
            }
            s->available_out_ = uVar12 + 0xd >> 3;
            s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
          }
          else {
            uVar5 = s->remaining_metadata_bytes_;
            uVar8 = (ulong)uVar5;
            if (uVar8 == 0) {
              s->remaining_metadata_bytes_ = 0xffffffff;
              s->stream_state_ = BROTLI_STREAM_PROCESSING;
              return 1;
            }
            uVar12 = *available_out;
            if (uVar12 == 0) {
              sVar18 = (size_t)uVar5;
              if (0xf < uVar5) {
                sVar18 = 0x10;
              }
              s->next_out_ = (uint8_t *)__dest;
              memcpy(__dest,*next_in,sVar18);
              *next_in = *next_in + sVar18;
              *available_in = *available_in - sVar18;
              s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)sVar18;
              s->available_out_ = sVar18;
            }
            else {
              if (uVar8 < uVar12) {
                uVar12 = uVar8;
              }
              memcpy(*next_out,*next_in,uVar12);
              *next_in = *next_in + uVar12;
              *available_in = *available_in - uVar12;
              s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)uVar12;
              *next_out = *next_out + uVar12;
              *available_out = *available_out - uVar12;
            }
          }
        }
        iVar4 = EncodeData(s,0,1,&s->available_out_,&s->next_out_);
      } while (iVar4 != 0);
    }
    return 0;
  }
  if (op == BROTLI_OPERATION_EMIT_METADATA) goto LAB_001231bd;
  if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
    return 0;
  }
  if ((s->stream_state_ != BROTLI_STREAM_PROCESSING) && (*available_in != 0)) {
    return 0;
  }
  uVar5 = (s->params).quality;
  if (1 < uVar5) {
    pMVar1 = &s->memory_manager_;
    while( true ) {
      do {
        while( true ) {
          uVar12 = s->input_pos_ - s->last_processed_pos_;
          sVar13 = InputBlockSize(s);
          uVar8 = sVar13 - uVar12;
          bVar21 = uVar8 == 0;
          if (sVar13 < uVar12) {
            uVar8 = 0;
          }
          if ((sVar13 < uVar12 || bVar21) || (uVar15 = *available_in, uVar15 == 0)) break;
          if (uVar8 < uVar15) {
            uVar15 = uVar8;
          }
          puVar11 = *next_in;
          EnsureInitialized(s);
          uVar20 = (s->ringbuffer_).pos_;
          uVar5 = (uint)uVar15;
          if ((uVar20 == 0) && (uVar15 < (s->ringbuffer_).tail_size_)) {
            (s->ringbuffer_).pos_ = uVar5;
            puVar9 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar5 + 2) + 7);
            puVar17 = (s->ringbuffer_).data_;
            if (puVar17 != (uint8_t *)0x0) {
              memcpy(puVar9,puVar17,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
              BrotliFree(pMVar1,(s->ringbuffer_).data_);
            }
            (s->ringbuffer_).data_ = puVar9;
            (s->ringbuffer_).cur_size_ = uVar5;
            (s->ringbuffer_).buffer_ = puVar9 + 2;
            puVar9[1] = '\0';
            (s->ringbuffer_).buffer_[-2] = '\0';
            for (lVar10 = 0; puVar17 = (s->ringbuffer_).buffer_, lVar10 != 7; lVar10 = lVar10 + 1) {
              puVar17[lVar10 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
            }
            memcpy(puVar17,puVar11,uVar15);
            uVar5 = (s->ringbuffer_).pos_;
          }
          else {
            uVar14 = (s->ringbuffer_).total_size_;
            if ((s->ringbuffer_).cur_size_ < uVar14) {
              puVar9 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar14 + 2) + 7);
              puVar17 = (s->ringbuffer_).data_;
              if (puVar17 != (uint8_t *)0x0) {
                memcpy(puVar9,puVar17,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
                BrotliFree(pMVar1,(s->ringbuffer_).data_);
              }
              (s->ringbuffer_).data_ = puVar9;
              (s->ringbuffer_).cur_size_ = uVar14;
              (s->ringbuffer_).buffer_ = puVar9 + 2;
              puVar9[1] = '\0';
              (s->ringbuffer_).buffer_[-2] = '\0';
              for (lVar10 = 0; puVar17 = (s->ringbuffer_).buffer_, lVar10 != 7; lVar10 = lVar10 + 1)
              {
                puVar17[lVar10 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
              }
              puVar17[(s->ringbuffer_).size_ - 2] = '\0';
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 1] = '\0';
              uVar20 = (s->ringbuffer_).pos_;
            }
            uVar19 = uVar20 & (s->ringbuffer_).mask_;
            uVar8 = (ulong)uVar19;
            uVar14 = (s->ringbuffer_).tail_size_;
            if (uVar19 < uVar14) {
              uVar12 = uVar14 - uVar8;
              if (uVar15 < uVar12) {
                uVar12 = uVar15;
              }
              memcpy((s->ringbuffer_).buffer_ + uVar8 + (s->ringbuffer_).size_,puVar11,uVar12);
            }
            puVar17 = (s->ringbuffer_).buffer_ + uVar8;
            sVar18 = uVar15;
            if ((ulong)(s->ringbuffer_).size_ < uVar8 + uVar15) {
              uVar12 = (s->ringbuffer_).total_size_ - uVar8;
              if (uVar15 < uVar12) {
                uVar12 = uVar15;
              }
              memcpy(puVar17,puVar11,uVar12);
              puVar17 = (s->ringbuffer_).buffer_;
              lVar10 = (s->ringbuffer_).size_ - uVar8;
              puVar11 = puVar11 + lVar10;
              sVar18 = uVar15 - lVar10;
            }
            memcpy(puVar17,puVar11,sVar18);
            puVar11 = (s->ringbuffer_).buffer_;
            uVar14 = (s->ringbuffer_).pos_;
            puVar11[-2] = puVar11[(s->ringbuffer_).size_ - 2];
            puVar11 = (s->ringbuffer_).buffer_;
            puVar11[-1] = puVar11[(s->ringbuffer_).size_ - 1];
            uVar5 = (uVar5 & 0x7fffffff) + ((s->ringbuffer_).pos_ & 0x7fffffff) |
                    uVar14 & 0x80000000;
            (s->ringbuffer_).pos_ = uVar5;
          }
          s->input_pos_ = s->input_pos_ + uVar15;
          if (uVar5 <= (s->ringbuffer_).mask_) {
            puVar11 = (s->ringbuffer_).buffer_;
            puVar17 = puVar11 + (ulong)uVar5 + 3;
            puVar17[0] = '\0';
            puVar17[1] = '\0';
            puVar17[2] = '\0';
            puVar17[3] = '\0';
            puVar11 = puVar11 + uVar5;
            puVar11[0] = '\0';
            puVar11[1] = '\0';
            puVar11[2] = '\0';
            puVar11[3] = '\0';
          }
          *next_in = *next_in + uVar15;
          *available_in = *available_in - uVar15;
        }
        iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
      } while (iVar4 != 0);
      if (((s->available_out_ != 0) || (op == BROTLI_OPERATION_PROCESS && uVar12 < sVar13)) ||
         (s->stream_state_ != BROTLI_STREAM_PROCESSING)) break;
      bVar21 = *available_in == 0;
      UpdateSizeHint(s,*available_in);
      uVar5 = (uint)(op == BROTLI_OPERATION_FINISH && bVar21);
      iVar4 = EncodeData(s,uVar5,(uint)(op == BROTLI_OPERATION_FLUSH && bVar21),&s->available_out_,
                         &s->next_out_);
      if (iVar4 == 0) {
        return 0;
      }
      if (bVar21 && (op == BROTLI_OPERATION_FLUSH || op == BROTLI_OPERATION_FINISH)) {
        s->stream_state_ = uVar5 + BROTLI_STREAM_FLUSH_REQUESTED;
      }
    }
    goto LAB_00123c7d;
  }
  uVar15 = 1L << ((byte)(s->params).lgwin & 0x3f);
  uVar8 = *available_in;
  uVar12 = uVar15;
  if (uVar8 < uVar15) {
    uVar12 = uVar8;
  }
  sVar13 = 0x20000;
  if (uVar12 < 0x20000) {
    sVar13 = uVar12;
  }
  pMVar1 = &s->memory_manager_;
  if (uVar5 == 1) {
    local_b0 = s->command_buf_;
    if ((local_b0 == (uint32_t *)0x0) && (0x1ffff < uVar12)) {
      puVar7 = (uint32_t *)BrotliAllocate(pMVar1,0x80000);
      s->command_buf_ = puVar7;
      local_88 = (uint8_t *)BrotliAllocate(pMVar1,0x20000);
      s->literal_buf_ = local_88;
      local_b0 = s->command_buf_;
      if (local_b0 != (uint32_t *)0x0) goto LAB_001239f0;
    }
    else {
      if (local_b0 != (uint32_t *)0x0) {
        local_88 = s->literal_buf_;
        goto LAB_001239f0;
      }
      if (uVar8 == 0) goto LAB_001239d5;
    }
    local_b0 = (uint32_t *)BrotliAllocate(pMVar1,sVar13 * 4);
    local_90 = (uint8_t *)BrotliAllocate(pMVar1,sVar13);
    local_98 = local_b0;
    local_88 = local_90;
  }
  else {
LAB_001239d5:
    local_88 = (uint8_t *)0x0;
    local_b0 = (uint32_t *)0x0;
LAB_001239f0:
    local_90 = (uint8_t *)0x0;
    local_98 = (uint32_t *)0x0;
  }
  local_40 = s->cmd_depths_;
  local_48 = s->cmd_bits_;
  local_50 = &s->cmd_code_numbits_;
  local_58 = s->cmd_code_;
  local_60 = op - BROTLI_OPERATION_FLUSH;
  local_5c = (op == BROTLI_OPERATION_FINISH) + BROTLI_STREAM_FLUSH_REQUESTED;
LAB_00123a46:
  do {
    iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
  } while (iVar4 != 0);
  if (((s->available_out_ == 0) && (s->stream_state_ == BROTLI_STREAM_PROCESSING)) &&
     (uVar8 = *available_in, op != BROTLI_OPERATION_PROCESS || uVar8 != 0)) {
    uVar12 = uVar8;
    if (uVar8 > uVar15) {
      uVar12 = uVar15;
    }
    storage_ix = (size_t)s->last_bytes_bits_;
    BVar6 = BROTLI_STREAM_FLUSH_REQUESTED;
    if (op != BROTLI_OPERATION_FLUSH || uVar8 != 0) goto code_r0x00123ad5;
    goto LAB_00123c46;
  }
  BrotliFree(pMVar1,local_98);
  BrotliFree(pMVar1,local_90);
LAB_00123c7d:
  CheckFlushComplete(s);
  return 1;
code_r0x00123ad5:
  uVar16 = uVar12 * 2 + 0x1f7;
  uVar3 = *available_out;
  if (uVar3 < uVar16) {
    puVar11 = GetBrotliStorage(s,uVar16);
  }
  else {
    puVar11 = *next_out;
  }
  uVar5 = (uint)(op == BROTLI_OPERATION_FINISH && uVar8 <= uVar15);
  *puVar11 = (uint8_t)s->last_bytes_;
  puVar11[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  table = GetHashTable(s,(s->params).quality,uVar12,&local_38);
  if ((s->params).quality == 0) {
    BrotliCompressFragmentFast
              (pMVar1,*next_in,uVar12,uVar5,table,local_38,local_40,local_48,local_50,local_58,
               &storage_ix,puVar11);
  }
  else {
    BrotliCompressFragmentTwoPass
              (pMVar1,*next_in,uVar12,uVar5,local_b0,local_88,table,local_38,&storage_ix,puVar11);
  }
  *next_in = *next_in + uVar12;
  *available_in = *available_in - uVar12;
  uVar12 = storage_ix >> 3;
  if (uVar3 < uVar16) {
    s->next_out_ = puVar11;
    s->available_out_ = uVar12;
  }
  else {
    *next_out = *next_out + uVar12;
    *available_out = *available_out - uVar12;
    sVar13 = s->total_out_ + uVar12;
    s->total_out_ = sVar13;
    if (total_out != (size_t *)0x0) {
      *total_out = sVar13;
    }
  }
  s->last_bytes_ = (ushort)puVar11[uVar12];
  s->last_bytes_bits_ = (byte)storage_ix & 7;
  BVar6 = local_5c;
  if (local_60 < 2 && uVar8 <= uVar15) {
LAB_00123c46:
    s->stream_state_ = BVar6;
  }
  goto LAB_00123a46;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompressStream(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out,uint8_t** next_out,
    size_t* total_out) {
  if (!EnsureInitialized(s)) return BROTLI_FALSE;

  /* Unfinished metadata block; check requirements. */
  if (s->remaining_metadata_bytes_ != BROTLI_UINT32_MAX) {
    if (*available_in != s->remaining_metadata_bytes_) return BROTLI_FALSE;
    if (op != BROTLI_OPERATION_EMIT_METADATA) return BROTLI_FALSE;
  }

  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s, 0);  /* First data metablock might be emitted here. */
    return ProcessMetadata(
        s, available_in, next_in, available_out, next_out, total_out);
  }

  if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD ||
      s->stream_state_ == BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  if (s->stream_state_ != BROTLI_STREAM_PROCESSING && *available_in != 0) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BrotliEncoderCompressStreamFast(s, op, available_in, next_in,
        available_out, next_out, total_out);
  }
  while (BROTLI_TRUE) {
    size_t remaining_block_size = RemainingInputBlockSize(s);

    if (remaining_block_size != 0 && *available_in != 0) {
      size_t copy_input_size =
          BROTLI_MIN(size_t, remaining_block_size, *available_in);
      CopyInputToRingBuffer(s, copy_input_size, *next_in);
      *next_in += copy_input_size;
      *available_in -= copy_input_size;
      continue;
    }

    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      continue;
    }

    /* Compress data only when internal output buffer is empty, stream is not
       finished and there is no pending flush request. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      if (remaining_block_size == 0 || op != BROTLI_OPERATION_PROCESS) {
        BROTLI_BOOL is_last = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FINISH);
        BROTLI_BOOL force_flush = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FLUSH);
        BROTLI_BOOL result;
        UpdateSizeHint(s, *available_in);
        result = EncodeData(s, is_last, force_flush,
            &s->available_out_, &s->next_out_);
        if (!result) return BROTLI_FALSE;
        if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
        continue;
      }
    }
    break;
  }
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}